

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanInf.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_63b2::FloatxNanInfTest_system_nans_Test::FloatxNanInfTest_system_nans_Test
          (FloatxNanInfTest_system_nans_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00173ab0;
  return;
}

Assistant:

TEST(FloatxNanInfTest, system_nans)
{
    fp_t constnan = 0.0 / 0.0;
    printf("constnan: ");
    show((fp_t)constnan);

    fp_t zero = 0;
    fp_t dynamicnan = zero / zero;
    printf("dynamicnan: ");
    show((fp_t)dynamicnan);

    EXPECT_NE(constnan, dynamicnan);  // holds only for NANs
    EXPECT_NE(constnan, nan);         // holds only for NANs
    EXPECT_NE(dynamicnan, nan);       // holds only for NANs

}